

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O2

ScenarioLowerBound * __thiscall
despot::BaseRockSample::CreateScenarioLowerBound
          (BaseRockSample *this,string *name,string *particle_bound_name)

{
  bool bVar1;
  RockSampleEastScenarioLowerBound *this_00;
  RandomPolicy *this_01;
  ParticleLowerBound *pPVar2;
  RockSampleENTScenarioLowerBound *this_02;
  RockSampleMMAPStateScenarioLowerBound *this_03;
  ostream *poVar3;
  BeliefMDP *pBVar4;
  string asStack_38 [32];
  
  bVar1 = std::operator==(name,"TRIVIAL");
  if (bVar1) {
    this_00 = (RockSampleEastScenarioLowerBound *)operator_new(0x10);
    despot::TrivialParticleLowerBound::TrivialParticleLowerBound
              ((TrivialParticleLowerBound *)this_00,(DSPOMDP *)&this->super_BeliefMDP);
  }
  else {
    bVar1 = std::operator==(name,"DEFAULT");
    if ((!bVar1) && (bVar1 = std::operator==(name,"EAST"), !bVar1)) {
      bVar1 = std::operator==(name,"RANDOM");
      if (bVar1) {
        this_01 = (RandomPolicy *)operator_new(0x38);
        std::__cxx11::string::string(asStack_38,(string *)particle_bound_name);
        pBVar4 = &this->super_BeliefMDP;
        pPVar2 = (ParticleLowerBound *)(**(code **)(*(long *)pBVar4 + 0x70))(pBVar4,asStack_38);
        despot::RandomPolicy::RandomPolicy(this_01,(DSPOMDP *)pBVar4,pPVar2);
        std::__cxx11::string::~string(asStack_38);
        return (ScenarioLowerBound *)this_01;
      }
      bVar1 = std::operator==(name,"ENT");
      if (bVar1) {
        this_02 = (RockSampleENTScenarioLowerBound *)operator_new(0x20);
        RockSampleENTScenarioLowerBound::RockSampleENTScenarioLowerBound
                  (this_02,(DSPOMDP *)&this->super_BeliefMDP);
        return &this_02->super_ScenarioLowerBound;
      }
      bVar1 = std::operator==(name,"MMAP");
      if (bVar1) {
        this_03 = (RockSampleMMAPStateScenarioLowerBound *)operator_new(0x38);
        RockSampleMMAPStateScenarioLowerBound::RockSampleMMAPStateScenarioLowerBound
                  (this_03,(DSPOMDP *)&this->super_BeliefMDP);
        return &this_03->super_ScenarioLowerBound;
      }
      bVar1 = std::operator==(name,"MODE");
      if (bVar1) {
        return (ScenarioLowerBound *)0x0;
      }
      poVar3 = std::operator<<((ostream *)&std::cerr,"Unsupported lower bound algorithm: ");
      poVar3 = std::operator<<(poVar3,(string *)name);
      std::endl<char,std::char_traits<char>>(poVar3);
      exit(0);
    }
    this_00 = (RockSampleEastScenarioLowerBound *)operator_new(0x20);
    RockSampleEastScenarioLowerBound::RockSampleEastScenarioLowerBound
              (this_00,(DSPOMDP *)&this->super_BeliefMDP);
  }
  return &this_00->super_ScenarioLowerBound;
}

Assistant:

ScenarioLowerBound* BaseRockSample::CreateScenarioLowerBound(string name, string
	particle_bound_name) const {
	if (name == "TRIVIAL") {
		return new TrivialParticleLowerBound(this);
	} else if (name == "DEFAULT" || name == "EAST") {
		// scenario_lower_bound_ = new BlindPolicy(this, Compass::EAST);
		return new RockSampleEastScenarioLowerBound(this);
	} else if (name == "RANDOM") {
		return new RandomPolicy(this,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "ENT") {
		return new RockSampleENTScenarioLowerBound(this);
	} else if (name == "MMAP") {
		return new RockSampleMMAPStateScenarioLowerBound(this);
	} else if (name == "MODE") {
		// scenario_lower_bound_ = new ModeStatePolicy(this);
		return NULL; // TODO
	} else {
		cerr << "Unsupported lower bound algorithm: " << name << endl;
		exit(0);
		return NULL;
	}
}